

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_ASAi_bnd.c
# Opt level: O1

int JacB(sunrealtype tB,N_Vector u,N_Vector uB,N_Vector fuB,SUNMatrix JB,void *user_dataB,
        N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  dVar1 = *(double *)((long)user_dataB + 0x10);
  dVar2 = *(double *)((long)user_dataB + 0x18);
  dVar7 = dVar1 + *(double *)((long)user_dataB + 0x20);
  dVar8 = -*(double *)((long)user_dataB + 0x20);
  lVar5 = 1;
  lVar6 = 0;
  do {
    lVar4 = 0;
    do {
      auVar9 = SUNBandMatrix_Column(JB,lVar6 + lVar4,fuB);
      fuB = auVar9._8_8_;
      pdVar3 = auVar9._0_8_;
      *pdVar3 = dVar7 + dVar7;
      if ((lVar4 == 0) || (pdVar3[-0x14] = dVar2 - dVar1, lVar4 != 0x30c)) {
        pdVar3[0x14] = -dVar1 - dVar2;
      }
      if (lVar5 == 1) {
LAB_00101ee9:
        pdVar3[1] = dVar8;
      }
      else {
        pdVar3[-1] = dVar8;
        if (lVar5 != 0x14) goto LAB_00101ee9;
      }
      lVar4 = lVar4 + 0x14;
    } while (lVar4 != 800);
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 1;
    if (lVar5 == 0x15) {
      return 0;
    }
  } while( true );
}

Assistant:

static int JacB(sunrealtype tB, N_Vector u, N_Vector uB, N_Vector fuB,
                SUNMatrix JB, void* user_dataB, N_Vector tmp1B, N_Vector tmp2B,
                N_Vector tmp3B)
{
  int i, j, k;
  sunrealtype *kthCol, hordc, horac, verdc;
  UserData data;

  /* The Jacobian of the adjoint system is: JB = -J^T */

  data  = (UserData)user_dataB;
  hordc = data->hdcoef;
  horac = data->hacoef;
  verdc = data->vdcoef;

  for (j = 1; j <= MY; j++)
  {
    for (i = 1; i <= MX; i++)
    {
      k      = j - 1 + (i - 1) * MY;
      kthCol = SUNBandMatrix_Column(JB, k);

      /* set the kth column of J */

      SM_COLUMN_ELEMENT_B(kthCol, k, k) = TWO * (verdc + hordc);
      if (i != 1) { SM_COLUMN_ELEMENT_B(kthCol, k - MY, k) = -hordc + horac; }
      if (i != MX) { SM_COLUMN_ELEMENT_B(kthCol, k + MY, k) = -hordc - horac; }
      if (j != 1) { SM_COLUMN_ELEMENT_B(kthCol, k - 1, k) = -verdc; }
      if (j != MY) { SM_COLUMN_ELEMENT_B(kthCol, k + 1, k) = -verdc; }
    }
  }

  return (0);
}